

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryGLImpl.cpp
# Opt level: O3

bool __thiscall
Diligent::QueryGLImpl::GetData(QueryGLImpl *this,void *pData,Uint32 DataSize,bool AutoInvalidate)

{
  QUERY_TYPE QVar1;
  uint *Args_1;
  QueryDataPipelineStatistics *QueryData;
  bool bVar2;
  GLenum err_1;
  GLenum err;
  string msg;
  GLuint ResultAvailable;
  uint local_64;
  undefined8 local_60;
  string local_58;
  GLuint local_34;
  
  QueryBase<Diligent::EngineGLImplTraits>::CheckQueryDataPtr
            (&this->super_QueryBase<Diligent::EngineGLImplTraits>,pData,DataSize);
  local_34 = 0;
  if ((this->super_QueryBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>.
      m_Desc.Type - QUERY_TYPE_OCCLUSION < 5) {
    (*__glewGetQueryObjectuiv)
              (*(GLuint *)&(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,0x8867,
               &local_34);
    local_60._0_4_ = glGetError();
    if ((uint)local_60 != 0) {
      LogError<false,char[27],char[17],unsigned_int>
                (false,"GetData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                 ,0x4f,(char (*) [27])"Failed to get query result",
                 (char (*) [17])"\nGL Error Code: ",(uint *)&local_60);
      FormatString<char[6]>(&local_58,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"GetData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                 ,0x4f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if ((pData != (void *)0x0) && (local_34 != 0)) {
      Args_1 = &switchD_00189c3c::switchdataD_0033d85c;
      switch((this->super_QueryBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
             .m_Desc.Type) {
      case QUERY_TYPE_OCCLUSION:
        local_60 = (ulong)local_60._4_4_ << 0x20;
        (*__glewGetQueryObjectuiv)
                  (*(GLuint *)&(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,
                   0x8866,(GLuint *)&local_60);
        local_64 = glGetError();
        if (local_64 != 0) {
          LogError<false,char[27],char[17],unsigned_int>
                    (false,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x60,(char (*) [27])"Failed to get query result",
                     (char (*) [17])"\nGL Error Code: ",&local_64);
          FormatString<char[6]>(&local_58,(char (*) [6])0x32e52e);
          DebugAssertionFailed
                    (local_58._M_dataplus._M_p,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        *(GLuint64 *)((long)pData + 8) = local_60 & 0xffffffff;
        break;
      case QUERY_TYPE_BINARY_OCCLUSION:
        local_60 = (ulong)local_60._4_4_ << 0x20;
        (*__glewGetQueryObjectuiv)
                  (*(GLuint *)&(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,
                   0x8866,(GLuint *)&local_60);
        local_64 = glGetError();
        if (local_64 != 0) {
          LogError<false,char[27],char[17],unsigned_int>
                    (false,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x6b,(char (*) [27])"Failed to get query result",
                     (char (*) [17])"\nGL Error Code: ",&local_64);
          FormatString<char[6]>(&local_58,(char (*) [6])0x32e52e);
          DebugAssertionFailed
                    (local_58._M_dataplus._M_p,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x6b);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        *(bool *)((long)pData + 4) = (uint)local_60 != 0;
        break;
      case QUERY_TYPE_TIMESTAMP:
      case QUERY_TYPE_DURATION:
        if (__glewGetQueryObjectui64v != (PFNGLGETQUERYOBJECTUI64VPROC)0x0) {
          local_60 = 0;
          (*__glewGetQueryObjectui64v)
                    (*(GLuint *)&(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,
                     0x8866,&local_60);
          local_64 = glGetError();
          if (local_64 != 0) {
            LogError<false,char[27],char[17],unsigned_int>
                      (false,"GetData",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                       ,0x82,(char (*) [27])"Failed to get query result",
                       (char (*) [17])"\nGL Error Code: ",&local_64);
            FormatString<char[6]>(&local_58,(char (*) [6])0x32e52e);
            Args_1 = (uint *)0x82;
            DebugAssertionFailed
                      (local_58._M_dataplus._M_p,"GetData",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                       ,0x82);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
          QVar1 = (this->super_QueryBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                  .m_Desc.Type;
          if ((QVar1 != QUERY_TYPE_TIMESTAMP) && (QVar1 != QUERY_TYPE_DURATION)) {
            FormatString<char[26],char[35]>
                      (&local_58,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"m_Desc.Type == QUERY_TYPE_DURATION",(char (*) [35])Args_1);
            DebugAssertionFailed
                      (local_58._M_dataplus._M_p,"GetData",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                       ,0x8c);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
          *(GLuint64 *)((long)pData + 8) = local_60;
          *(undefined8 *)((long)pData + 0x10) = 1000000000;
        }
        break;
      case QUERY_TYPE_PIPELINE_STATISTICS:
        local_60 = (ulong)local_60._4_4_ << 0x20;
        (*__glewGetQueryObjectuiv)
                  (*(GLuint *)&(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,
                   0x8866,(GLuint *)&local_60);
        local_64 = glGetError();
        if (local_64 != 0) {
          LogError<false,char[27],char[17],unsigned_int>
                    (false,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x76,(char (*) [27])"Failed to get query result",
                     (char (*) [17])"\nGL Error Code: ",&local_64);
          FormatString<char[6]>(&local_58,(char (*) [6])0x32e52e);
          DebugAssertionFailed
                    (local_58._M_dataplus._M_p,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x76);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        *(GLuint64 *)((long)pData + 0x20) = local_60 & 0xffffffff;
        break;
      default:
        FormatString<char[22]>(&local_58,(char (*) [22])"Unexpected query type");
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"GetData",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                   ,0x97);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00189fbd;
      }
      if (AutoInvalidate) {
        (this->super_QueryBase<Diligent::EngineGLImplTraits>).m_State = Inactive;
      }
    }
    bVar2 = local_34 != 0;
  }
  else {
LAB_00189fbd:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool QueryGLImpl::GetData(void* pData, Uint32 DataSize, bool AutoInvalidate)
{
    TQueryBase::CheckQueryDataPtr(pData, DataSize);

    GLuint ResultAvailable = GL_FALSE;

    switch (m_Desc.Type)
    {
#if GL_SAMPLES_PASSED
        case QUERY_TYPE_OCCLUSION:
#endif

        case QUERY_TYPE_BINARY_OCCLUSION:

#if GL_PRIMITIVES_GENERATED
        case QUERY_TYPE_PIPELINE_STATISTICS:
#endif

        case QUERY_TYPE_DURATION:
        case QUERY_TYPE_TIMESTAMP:
            glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT_AVAILABLE, &ResultAvailable);
            DEV_CHECK_GL_ERROR("Failed to get query result");
            break;

        default:
            return false;
    }

    if (ResultAvailable && pData != nullptr)
    {
        switch (m_Desc.Type)
        {
            case QUERY_TYPE_OCCLUSION:
            {
                auto& QueryData = *reinterpret_cast<QueryDataOcclusion*>(pData);

                GLuint SamplesPassed = 0;
                glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT, &SamplesPassed);
                DEV_CHECK_GL_ERROR("Failed to get query result");
                QueryData.NumSamples = SamplesPassed;
            }
            break;

            case QUERY_TYPE_BINARY_OCCLUSION:
            {
                auto& QueryData = *reinterpret_cast<QueryDataBinaryOcclusion*>(pData);

                GLuint AnySamplePassed = 0;
                glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT, &AnySamplePassed);
                DEV_CHECK_GL_ERROR("Failed to get query result");
                QueryData.AnySamplePassed = AnySamplePassed != 0;
            }
            break;

            case QUERY_TYPE_PIPELINE_STATISTICS:
            {
                auto& QueryData = *reinterpret_cast<QueryDataPipelineStatistics*>(pData);

                GLuint PrimitivesGenerated = 0;
                glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT, &PrimitivesGenerated);
                DEV_CHECK_GL_ERROR("Failed to get query result");
                QueryData.ClippingInvocations = PrimitivesGenerated;
            }
            break;

            case QUERY_TYPE_TIMESTAMP:
            case QUERY_TYPE_DURATION:
            {
                if (glGetQueryObjectui64v != nullptr)
                {
                    GLuint64 Counter = 0;
                    glGetQueryObjectui64v(m_GlQuery, GL_QUERY_RESULT, &Counter);
                    DEV_CHECK_GL_ERROR("Failed to get query result");
                    if (m_Desc.Type == QUERY_TYPE_TIMESTAMP)
                    {
                        auto& QueryData   = *reinterpret_cast<QueryDataTimestamp*>(pData);
                        QueryData.Counter = Counter;
                        // Counter is always measured in nanoseconds (10^-9 seconds)
                        QueryData.Frequency = 1000000000;
                    }
                    else
                    {
                        VERIFY_EXPR(m_Desc.Type == QUERY_TYPE_DURATION);
                        auto& QueryData    = *reinterpret_cast<QueryDataDuration*>(pData);
                        QueryData.Duration = Counter;
                        // Counter is always measured in nanoseconds (10^-9 seconds)
                        QueryData.Frequency = 1000000000;
                    }
                }
            }
            break;

            default:
                UNEXPECTED("Unexpected query type");
                return false;
        }

        if (AutoInvalidate)
        {
            Invalidate();
        }
    }

    return ResultAvailable != GL_FALSE;
}